

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parson.c
# Opt level: O0

JSON_Value * parse_value(char **string,size_t nesting)

{
  ushort **ppuVar1;
  size_t nesting_local;
  char **string_local;
  
  if (nesting < 0x801) {
    while (ppuVar1 = __ctype_b_loc(), ((*ppuVar1)[(int)(uint)(byte)**string] & 0x2000) != 0) {
      *string = *string + 1;
    }
    switch(**string) {
    case '\"':
      string_local = (char **)parse_string_value(string);
      break;
    default:
      string_local = (char **)0x0;
      break;
    case '-':
    case '0':
    case '1':
    case '2':
    case '3':
    case '4':
    case '5':
    case '6':
    case '7':
    case '8':
    case '9':
      string_local = (char **)parse_number_value(string);
      break;
    case '[':
      string_local = (char **)parse_array_value(string,nesting + 1);
      break;
    case 'f':
    case 't':
      string_local = (char **)parse_boolean_value(string);
      break;
    case 'n':
      string_local = (char **)parse_null_value(string);
      break;
    case '{':
      string_local = (char **)parse_object_value(string,nesting + 1);
    }
  }
  else {
    string_local = (char **)0x0;
  }
  return (JSON_Value *)string_local;
}

Assistant:

static JSON_Value * parse_value(const char **string, size_t nesting) {
    if (nesting > MAX_NESTING) {
        return NULL;
    }
    SKIP_WHITESPACES(string);
    switch (**string) {
        case '{':
            return parse_object_value(string, nesting + 1);
        case '[':
            return parse_array_value(string, nesting + 1);
        case '\"':
            return parse_string_value(string);
        case 'f': case 't':
            return parse_boolean_value(string);
        case '-':
        case '0': case '1': case '2': case '3': case '4':
        case '5': case '6': case '7': case '8': case '9':
            return parse_number_value(string);
        case 'n':
            return parse_null_value(string);
        default:
            return NULL;
    }
}